

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
ProfiledInitProperty<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout,Var instance)

{
  byte bVar1;
  PropertyId propertyId;
  RecyclableObject *object;
  InlineCache *inlineCache;
  Var value;
  FunctionBody *functionBody;
  Var instance_local;
  OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  object = VarTo<Js::RecyclableObject>(instance);
  propertyId = GetPropertyIdFromCacheId(this,(uint)playout->inlineCacheIndex);
  inlineCache = GetInlineCache(this,(uint)playout->inlineCacheIndex);
  bVar1 = playout->inlineCacheIndex;
  value = GetReg<unsigned_char>(this,playout->Value);
  functionBody = GetFunctionBody(this);
  ProfilingHelpers::ProfiledInitFld(object,propertyId,inlineCache,(uint)bVar1,value,functionBody);
  return;
}

Assistant:

void InterpreterStackFrame::ProfiledInitProperty(unaligned T* playout, Var instance)
    {
        ProfilingHelpers::ProfiledInitFld(
            VarTo<RecyclableObject>(instance),
            GetPropertyIdFromCacheId(playout->inlineCacheIndex),
            GetInlineCache(playout->inlineCacheIndex),
            playout->inlineCacheIndex,
            GetReg(playout->Value),
            GetFunctionBody());
    }